

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_orphaned_memorydata(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar9 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    ppvVar8 = &(this->super_ModelWriter).layers;
    uVar10 = lVar9 >> 3;
    lVar9 = 0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar8)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9]->type);
      if (iVar4 == 0) {
        uVar11 = lVar9 + 1;
        if (uVar11 < uVar10) {
          iVar4 = *(((*ppvVar8)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar9]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar5 = std::__cxx11::string::compare
                              ((char *)&((*ppvVar8)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar11]->type);
            if (iVar5 != 0) {
              pLVar2 = ((*ppvVar8)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
              lVar3 = *(long *)&(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data;
              lVar6 = (long)*(pointer *)
                             ((long)&(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl + 8) - lVar3;
              if (lVar6 != 0) {
                lVar6 = lVar6 >> 2;
                lVar7 = 0;
                do {
                  if (*(int *)(lVar3 + lVar7 * 4) == iVar4) goto LAB_0014c11e;
                  lVar7 = lVar7 + 1;
                } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar10);
        }
        eliminate_orphaned_memorydata();
      }
LAB_0014c11e:
      lVar9 = lVar9 + 1;
    } while (lVar9 != uVar10 + (uVar10 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_orphaned_memorydata()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - X
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool orphaned = true;
            for (size_t k = 0; k < layers[j]->bottoms.size(); k++)
            {
                if (layers[j]->bottoms[k] == top_blob_index)
                {
                    orphaned = false;
                    break;
                }
            }

            if (!orphaned)
                break;
        }

        if (j < layer_count)
            continue;

        // assert orphaned == true
        fprintf(stderr, "eliminate_orphaned_memorydata %s\n", layers[i]->name.c_str());

        layers[i]->type = "ncnnfused";
    }

    return 0;
}